

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::inductiveLoopCheck
          (TParseContext *this,TSourceLoc *loc,TIntermNode *init,TIntermLoop *loop)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined4 extraout_var_01;
  long *plVar6;
  long *plVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar8;
  char *pcVar9;
  _func_int **pp_Var10;
  _func_int *UNRECOVERED_JUMPTABLE;
  longlong loopIndex;
  longlong local_38;
  
  if ((init != (TIntermNode *)0x0) &&
     (iVar4 = (*init->_vptr_TIntermNode[6])(init), CONCAT44(extraout_var,iVar4) != 0)) {
    iVar4 = (*init->_vptr_TIntermNode[6])(init);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 400))
                      ((long *)CONCAT44(extraout_var_00,iVar4));
    if (*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) == 8) {
      iVar4 = (*init->_vptr_TIntermNode[6])(init);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 400))
                        ((long *)CONCAT44(extraout_var_01,iVar4));
      plVar6 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar5 + 8) + 0x40))();
      if (plVar6 != (long *)0x0) {
        plVar7 = (long *)(**(code **)(*plVar6 + 0xf0))(plVar6);
        cVar3 = (**(code **)(*plVar7 + 0xc0))(plVar7);
        if ((cVar3 == '\0') ||
           ((iVar4 = (**(code **)(*plVar6 + 0x100))(plVar6), iVar4 != 8 &&
            (iVar4 = (**(code **)(*plVar6 + 0x100))(plVar6), iVar4 != 1)))) {
          UNRECOVERED_JUMPTABLE =
               (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
          pcVar9 = "inductive loop requires a scalar \'int\' or \'float\' loop index";
          goto LAB_004b3fe8;
        }
        if ((int)plVar6[0x17] == 0x1df) {
          plVar7 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
          lVar5 = (**(code **)(*plVar7 + 0x60))(plVar7);
          if (lVar5 != 0) {
            plVar7 = (long *)(**(code **)(*plVar6 + 0x198))(plVar6);
            lVar5 = (**(code **)(*plVar7 + 0x28))(plVar7);
            if (lVar5 != 0) {
              plVar6 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
              plVar6 = (long *)(**(code **)(*plVar6 + 0x60))(plVar6);
              local_38 = (**(code **)(*plVar6 + 0x180))(plVar6);
              std::
              _Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
              ::_M_insert_unique<long_long_const&>
                        ((_Rb_tree<long_long,long_long,std::_Identity<long_long>,std::less<long_long>,std::allocator<long_long>>
                          *)&this->inductiveLoopIds,&local_38);
              if (loop->test != (TIntermTyped *)0x0) {
                iVar4 = (*(loop->test->super_TIntermNode)._vptr_TIntermNode[8])();
                plVar6 = (long *)CONCAT44(extraout_var_02,iVar4);
                if (plVar6 != (long *)0x0) {
                  uVar1 = *(uint *)(plVar6 + 0x17);
                  plVar7 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
                  lVar5 = (**(code **)(*plVar7 + 0x60))(plVar7);
                  if (lVar5 != 0) {
                    plVar7 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
                    plVar7 = (long *)(**(code **)(*plVar7 + 0x60))(plVar7);
                    lVar5 = (**(code **)(*plVar7 + 0x180))(plVar7);
                    if (lVar5 == local_38) {
                      plVar6 = (long *)(**(code **)(*plVar6 + 0x198))(plVar6);
                      lVar5 = (**(code **)(*plVar6 + 0x28))(plVar6);
                      if ((~(0x2a < uVar1 | (byte)(0x67ffffffff >> ((byte)uVar1 & 0x3f))) &
                          lVar5 != 0) != 0) {
                        if (loop->terminal != (TIntermTyped *)0x0) {
                          iVar4 = (*(loop->terminal->super_TIntermNode)._vptr_TIntermNode[7])();
                          plVar6 = (long *)CONCAT44(extraout_var_03,iVar4);
                          iVar4 = (*(loop->terminal->super_TIntermNode)._vptr_TIntermNode[8])();
                          plVar7 = (long *)CONCAT44(extraout_var_04,iVar4);
                          if (plVar6 != (long *)0x0 || plVar7 != (long *)0x0) {
                            iVar4 = (*(loop->terminal->super_TIntermNode)._vptr_TIntermNode[4])();
                            iVar4 = *(int *)(CONCAT44(extraout_var_05,iVar4) + 0xb8);
                            bVar2 = false;
                            if ((1 < iVar4 - 0xcU) && (1 < iVar4 - 0x1e0U)) {
                              bVar2 = true;
                            }
                            if (plVar7 == (long *)0x0) {
LAB_004b40db:
                              if (plVar6 != (long *)0x0) goto LAB_004b40f3;
                              lVar5 = local_38;
                              if (!bVar2) goto LAB_004b414b;
                            }
                            else {
                              plVar8 = (long *)(**(code **)(*plVar7 + 400))(plVar7);
                              lVar5 = (**(code **)(*plVar8 + 0x60))(plVar8);
                              if (lVar5 != 0) {
                                plVar8 = (long *)(**(code **)(*plVar7 + 400))(plVar7);
                                plVar8 = (long *)(**(code **)(*plVar8 + 0x60))(plVar8);
                                lVar5 = (**(code **)(*plVar8 + 0x180))(plVar8);
                                if (lVar5 == local_38) {
                                  plVar7 = (long *)(**(code **)(*plVar7 + 0x198))(plVar7);
                                  lVar5 = (**(code **)(*plVar7 + 0x28))(plVar7);
                                  if (lVar5 != 0) goto LAB_004b40db;
                                }
                              }
                              bVar2 = true;
                              if (plVar6 != (long *)0x0) {
LAB_004b40f3:
                                plVar7 = (long *)(**(code **)(*plVar6 + 0x188))(plVar6);
                                lVar5 = (**(code **)(*plVar7 + 0x60))(plVar7);
                                if (lVar5 != 0) {
                                  plVar6 = (long *)(**(code **)(*plVar6 + 0x188))(plVar6);
                                  plVar6 = (long *)(**(code **)(*plVar6 + 0x60))(plVar6);
                                  lVar5 = (**(code **)(*plVar6 + 0x180))(plVar6);
                                  if (!bVar2 && lVar5 == local_38) {
LAB_004b414b:
                                    inductiveLoopBodyCheck
                                              (this,loop->body,lVar5,
                                               (this->super_TParseContextBase).symbolTable);
                                    return;
                                  }
                                }
                              }
                            }
                          }
                        }
                        pp_Var10 = (this->super_TParseContextBase).super_TParseVersions.
                                   _vptr_TParseVersions;
                        pcVar9 = 
                        "inductive-loop termination requires the form \"loop-index++, loop-index--, loop-index += constant-expression, or loop-index -= constant-expression\""
                        ;
                        goto LAB_004b3fab;
                      }
                    }
                  }
                }
              }
              pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar9 = 
              "inductive-loop condition requires the form \"loop-index <comparison-op> constant-expression\""
              ;
LAB_004b3fab:
              (*pp_Var10[0x2d])(this,loc,pcVar9,"limitations","");
              return;
            }
          }
        }
      }
    }
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar9 = 
  "inductive-loop init-declaration requires the form \"type-specifier loop-index = constant-expression\""
  ;
LAB_004b3fe8:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar9,"limitations","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::inductiveLoopCheck(const TSourceLoc& loc, TIntermNode* init, TIntermLoop* loop)
{
    // loop index init must exist and be a declaration, which shows up in the AST as an aggregate of size 1 of the declaration
    bool badInit = false;
    if (! init || ! init->getAsAggregate() || init->getAsAggregate()->getSequence().size() != 1)
        badInit = true;
    TIntermBinary* binaryInit = nullptr;
    if (! badInit) {
        // get the declaration assignment
        binaryInit = init->getAsAggregate()->getSequence()[0]->getAsBinaryNode();
        if (! binaryInit)
            badInit = true;
    }
    if (badInit) {
        error(loc, "inductive-loop init-declaration requires the form \"type-specifier loop-index = constant-expression\"", "limitations", "");
        return;
    }

    // loop index must be type int or float
    if (! binaryInit->getType().isScalar() || (binaryInit->getBasicType() != EbtInt && binaryInit->getBasicType() != EbtFloat)) {
        error(loc, "inductive loop requires a scalar 'int' or 'float' loop index", "limitations", "");
        return;
    }

    // init is the form "loop-index = constant"
    if (binaryInit->getOp() != EOpAssign || ! binaryInit->getLeft()->getAsSymbolNode() || ! binaryInit->getRight()->getAsConstantUnion()) {
        error(loc, "inductive-loop init-declaration requires the form \"type-specifier loop-index = constant-expression\"", "limitations", "");
        return;
    }

    // get the unique id of the loop index
    long long loopIndex = binaryInit->getLeft()->getAsSymbolNode()->getId();
    inductiveLoopIds.insert(loopIndex);

    // condition's form must be "loop-index relational-operator constant-expression"
    bool badCond = ! loop->getTest();
    if (! badCond) {
        TIntermBinary* binaryCond = loop->getTest()->getAsBinaryNode();
        badCond = ! binaryCond;
        if (! badCond) {
            switch (binaryCond->getOp()) {
            case EOpGreaterThan:
            case EOpGreaterThanEqual:
            case EOpLessThan:
            case EOpLessThanEqual:
            case EOpEqual:
            case EOpNotEqual:
                break;
            default:
                badCond = true;
            }
        }
        if (binaryCond && (! binaryCond->getLeft()->getAsSymbolNode() ||
                           binaryCond->getLeft()->getAsSymbolNode()->getId() != loopIndex ||
                           ! binaryCond->getRight()->getAsConstantUnion()))
            badCond = true;
    }
    if (badCond) {
        error(loc, "inductive-loop condition requires the form \"loop-index <comparison-op> constant-expression\"", "limitations", "");
        return;
    }

    // loop-index++
    // loop-index--
    // loop-index += constant-expression
    // loop-index -= constant-expression
    bool badTerminal = ! loop->getTerminal();
    if (! badTerminal) {
        TIntermUnary* unaryTerminal = loop->getTerminal()->getAsUnaryNode();
        TIntermBinary* binaryTerminal = loop->getTerminal()->getAsBinaryNode();
        if (unaryTerminal || binaryTerminal) {
            switch(loop->getTerminal()->getAsOperator()->getOp()) {
            case EOpPostDecrement:
            case EOpPostIncrement:
            case EOpAddAssign:
            case EOpSubAssign:
                break;
            default:
                badTerminal = true;
            }
        } else
            badTerminal = true;
        if (binaryTerminal && (! binaryTerminal->getLeft()->getAsSymbolNode() ||
                               binaryTerminal->getLeft()->getAsSymbolNode()->getId() != loopIndex ||
                               ! binaryTerminal->getRight()->getAsConstantUnion()))
            badTerminal = true;
        if (unaryTerminal && (! unaryTerminal->getOperand()->getAsSymbolNode() ||
                              unaryTerminal->getOperand()->getAsSymbolNode()->getId() != loopIndex))
            badTerminal = true;
    }
    if (badTerminal) {
        error(loc, "inductive-loop termination requires the form \"loop-index++, loop-index--, loop-index += constant-expression, or loop-index -= constant-expression\"", "limitations", "");
        return;
    }

    // the body
    inductiveLoopBodyCheck(loop->getBody(), loopIndex, symbolTable);
}